

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void Lib::OutputAll<const_char_*,_unsigned_int,_const_char_*>::apply
               (ostream *out,char *m,uint ms,char *ms_1)

{
  size_t sVar1;
  
  if (m == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar1 = strlen(m);
    std::__ostream_insert<char,std::char_traits<char>>(out,m,sVar1);
  }
  std::ostream::_M_insert<unsigned_long>((ulong)out);
  OutputAll<const_char_*>::apply(out,ms_1);
  return;
}

Assistant:

static void apply(std::ostream& out, M m, Ms... ms) {
    out << m;
    OutputAll<Ms...>::apply(out, ms...);
  }